

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

Benchmark * __thiscall benchmark::internal::Benchmark::Range(Benchmark *this,int start,int limit)

{
  int iVar1;
  CheckHandler local_20;
  
  iVar1 = BenchmarkImp::ArgsCnt(this->imp_);
  if (iVar1 != -1) {
    iVar1 = BenchmarkImp::ArgsCnt(this->imp_);
    if (iVar1 != 1) {
      CheckHandler::CheckHandler
                (&local_20,"imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
                 ,"Range",0x2ad);
      CheckHandler::~CheckHandler(&local_20);
    }
  }
  GetNullLogInstance();
  BenchmarkImp::Range(this->imp_,start,limit);
  return this;
}

Assistant:

Benchmark* Benchmark::Range(int start, int limit) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1);
  imp_->Range(start, limit);
  return this;
}